

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall
BVSparse<Memory::JitArenaAllocator>::~BVSparse(BVSparse<Memory::JitArenaAllocator> *this)

{
  BVSparseNode *local_18;
  BVSparseNode *curNode;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  for (local_18 = this->head; local_18 != (BVSparseNode *)0x0;
      local_18 = DeleteNode(this,local_18,true)) {
  }
  return;
}

Assistant:

BVSparse<TAllocator>::~BVSparse()
{
    BVSparseNode * curNode = this->head;
    while (curNode != nullptr)
    {
        curNode = this->DeleteNode(curNode);
    }
}